

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set-pseudo-dt-data-loc.cpp
# Opt level: O0

DataLocation * __thiscall
yactfr::internal::DataLocSetter::_dataLocFromPseudoDataLoc
          (DataLocation *__return_storage_ptr__,DataLocSetter *this,PseudoDataLoc *pseudoDataLoc)

{
  Scope SVar1;
  bool bVar2;
  Kind KVar3;
  PathElems *pseudoDataLocPathElems;
  optional<yactfr::Scope> *poVar4;
  reference_const_type pSVar5;
  pointer this_00;
  const_reference ppbVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_138;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  __normal_iterator<const_std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_*,_std::vector<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
  local_120;
  const_iterator entryIt;
  PathElements pathElems;
  _tGetPathElemsSuffixRelRet local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  _tGetPathElemsSuffixRelRet local_b0;
  undefined1 local_90 [8];
  PathElements pathElemsSuffix;
  __normal_iterator<const_std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_*,_std::vector<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
  local_70;
  __normal_iterator<const_std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_*,_std::vector<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
  searchEntryIt;
  undefined1 local_40 [8];
  PathElements pathElems_1;
  PseudoDataLoc *pseudoDataLoc_local;
  DataLocSetter *this_local;
  
  pathElems_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pseudoDataLoc;
  KVar3 = PseudoDataLoc::kind(pseudoDataLoc);
  if (KVar3 == Env) {
    __assert_fail("pseudoDataLoc.kind() != PseudoDataLoc::Kind::Env",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/set-pseudo-dt-data-loc.cpp"
                  ,0xb3,
                  "DataLocation yactfr::internal::DataLocSetter::_dataLocFromPseudoDataLoc(const PseudoDataLoc &) const"
                 );
  }
  KVar3 = PseudoDataLoc::kind((PseudoDataLoc *)
                              pathElems_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (KVar3 == Abs) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
    pseudoDataLocPathElems =
         PseudoDataLoc::pathElems_abi_cxx11_
                   ((PseudoDataLoc *)
                    pathElems_1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    anon_unknown_11::pseudoDataLocPathElemsToPathElems
              (pseudoDataLocPathElems,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40);
    poVar4 = PseudoDataLoc::scope
                       ((PseudoDataLoc *)
                        pathElems_1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = boost::optional<yactfr::Scope>::operator!(poVar4);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("pseudoDataLoc.scope()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/set-pseudo-dt-data-loc.cpp"
                    ,0xba,
                    "DataLocation yactfr::internal::DataLocSetter::_dataLocFromPseudoDataLoc(const PseudoDataLoc &) const"
                   );
    }
    poVar4 = PseudoDataLoc::scope
                       ((PseudoDataLoc *)
                        pathElems_1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar5 = boost::optional<yactfr::Scope>::operator*(poVar4);
    SVar1 = *pSVar5;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&searchEntryIt,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
    DataLocation::DataLocation
              (__return_storage_ptr__,SVar1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&searchEntryIt);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&searchEntryIt);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
  }
  else {
    pathElemsSuffix.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
                  ::end(&this->_memberNames);
    local_70 = __gnu_cxx::
               __normal_iterator<const_std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_*,_std::vector<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
               ::operator-((__normal_iterator<const_std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_*,_std::vector<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
                            *)&pathElemsSuffix.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_90);
    KVar3 = PseudoDataLoc::kind((PseudoDataLoc *)
                                pathElems_1.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (KVar3 == Rel1) {
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_70._M_current;
      _getPathElemsSuffixRel1
                (&local_b0,this,
                 (PseudoDataLoc *)
                 pathElems_1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (const_iterator)local_70._M_current);
      std::
      tie<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>const*,std::vector<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>,std::allocator<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>>>>>
                (&local_c8,
                 (__normal_iterator<const_std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_*,_std::vector<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
                  *)local_90);
      std::
      tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>const*,std::vector<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>,std::allocator<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>>>>&>
      ::operator=((tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>const*,std::vector<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>,std::allocator<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>>>>&>
                   *)&local_c8,&local_b0);
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<const_std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_*,_std::vector<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>_>
      ::~pair(&local_b0);
    }
    else {
      _getPathElemsSuffixRel2
                (&local_e8,this,
                 (PseudoDataLoc *)
                 pathElems_1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (const_iterator)local_70._M_current);
      std::
      tie<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>const*,std::vector<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>,std::allocator<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>>>>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&pathElems.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (__normal_iterator<const_std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_*,_std::vector<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
                  *)local_90);
      std::
      tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>const*,std::vector<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>,std::allocator<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>>>>&>
      ::operator=((tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>const*,std::vector<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>,std::allocator<std::vector<std::__cxx11::string_const*,std::allocator<std::__cxx11::string_const*>>>>>&>
                   *)&pathElems.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_e8);
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<const_std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_*,_std::vector<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>_>
      ::~pair(&local_e8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&entryIt);
    local_120._M_current =
         (vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
          *)std::
            vector<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
            ::begin(&this->_memberNames);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&local_120,&local_70);
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_*,_std::vector<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
                ::operator->(&local_120);
      ppbVar6 = std::
                vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                ::back(this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&entryIt,*ppbVar6);
      __gnu_cxx::
      __normal_iterator<const_std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_*,_std::vector<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
      ::operator++(&local_120);
    }
    local_128._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90);
    local_130._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_90);
    local_138 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::
                   back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                             ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&entryIt);
    local_140 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::
                   copy<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             (local_128,local_130,
                              (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )local_138);
    SVar1 = this->_scope;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_158,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&entryIt);
    DataLocation::DataLocation(__return_storage_ptr__,SVar1,&local_158);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_158);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&entryIt);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

DataLocation _dataLocFromPseudoDataLoc(const PseudoDataLoc& pseudoDataLoc) const
    {
        /*
         * The `PseudoDataLoc::Kind::Env` is a temporary kind, which the
         * TSDL parser uses, leading to a `PseudoSlArrayType` instance
         * in TsdlParser::_parseArraySubscripts().
         *
         * Therefore it mustn't exist at this point.
         */
        assert(pseudoDataLoc.kind() != PseudoDataLoc::Kind::Env);

        if (pseudoDataLoc.kind() == PseudoDataLoc::Kind::Abs) {
            // already absolute
            DataLocation::PathElements pathElems;

            pseudoDataLocPathElemsToPathElems(pseudoDataLoc.pathElems(), pathElems);
            assert(pseudoDataLoc.scope());
            return DataLocation {*pseudoDataLoc.scope(), std::move(pathElems)};
        }

        /*
         * Relative location: start the search with the last entry
         * of `_memberNames`.
         */
        auto searchEntryIt = _memberNames.end() - 1;

        // relative data location path elements to append at the end
        DataLocation::PathElements pathElemsSuffix;

        if (pseudoDataLoc.kind() == PseudoDataLoc::Kind::Rel1) {
            std::tie(pathElemsSuffix, searchEntryIt) = this->_getPathElemsSuffixRel1(pseudoDataLoc,
                                                                                     searchEntryIt);
        } else {
            std::tie(pathElemsSuffix, searchEntryIt) = this->_getPathElemsSuffixRel2(pseudoDataLoc,
                                                                                     searchEntryIt);
        }

        /*
         * Now we go back from the first entry of `_memberNames` and
         * append the parent member names until we reach `searchEntryIt`
         * (excluding it).
         */
        DataLocation::PathElements pathElems;

        for (auto entryIt = _memberNames.begin(); entryIt != searchEntryIt; ++entryIt) {
            // last item of the entry is the parent name
            pathElems.push_back(*entryIt->back());
        }

        // append remaining suffix
        std::copy(pathElemsSuffix.begin(), pathElemsSuffix.end(), std::back_inserter(pathElems));
        return DataLocation {_scope, std::move(pathElems)};
    }